

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeAtomicRMW<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,AtomicRMWOp op,Type type,uint8_t bytes)

{
  __index_type *__return_storage_ptr___00;
  Name *mem_00;
  Memarg *pMVar1;
  bool bVar2;
  Err local_140;
  Err *local_120;
  Err *err_1;
  Result<wasm::WATParser::Memarg> _val_1;
  Result<wasm::WATParser::Memarg> arg;
  Err local_c0;
  Err *local_a0;
  Err *err;
  undefined1 local_88 [8];
  MaybeResult<wasm::Name> _val;
  MaybeResult<wasm::Name> mem;
  AtomicRMWOp op_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  Type type_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20);
  maybeMemidx<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<wasm::Name> *)__return_storage_ptr___00,ctx);
  MaybeResult<wasm::Name>::MaybeResult
            ((MaybeResult<wasm::Name> *)local_88,
             (MaybeResult<wasm::Name> *)__return_storage_ptr___00);
  local_a0 = MaybeResult<wasm::Name>::getErr((MaybeResult<wasm::Name> *)local_88);
  bVar2 = local_a0 == (Err *)0x0;
  if (!bVar2) {
    wasm::Err::Err(&local_c0,local_a0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c0);
    wasm::Err::~Err(&local_c0);
  }
  MaybeResult<wasm::Name>::~MaybeResult((MaybeResult<wasm::Name> *)local_88);
  if (bVar2) {
    memarg<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::WATParser::Memarg> *)
               ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20),ctx,
               (uint)bytes);
    Result<wasm::WATParser::Memarg>::Result
              ((Result<wasm::WATParser::Memarg> *)&err_1,
               (Result<wasm::WATParser::Memarg> *)
               ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20));
    local_120 = Result<wasm::WATParser::Memarg>::getErr((Result<wasm::WATParser::Memarg> *)&err_1);
    bVar2 = local_120 == (Err *)0x0;
    if (!bVar2) {
      wasm::Err::Err(&local_140,local_120);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_140);
      wasm::Err::~Err(&local_140);
    }
    Result<wasm::WATParser::Memarg>::~Result((Result<wasm::WATParser::Memarg> *)&err_1);
    if (bVar2) {
      mem_00 = MaybeResult<wasm::Name>::getPtr
                         ((MaybeResult<wasm::Name> *)
                          ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20))
      ;
      pMVar1 = Result<wasm::WATParser::Memarg>::operator*
                         ((Result<wasm::WATParser::Memarg> *)
                          ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>
                                  .super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20)
                         );
      ParseDefsCtx::makeAtomicRMW
                (__return_storage_ptr__,ctx,pos,annotations,op,type,(uint)bytes,mem_00,*pMVar1);
    }
    Result<wasm::WATParser::Memarg>::~Result
              ((Result<wasm::WATParser::Memarg> *)
               ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::Name>::~MaybeResult
            ((MaybeResult<wasm::Name> *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeAtomicRMW(Ctx& ctx,
                       Index pos,
                       const std::vector<Annotation>& annotations,
                       AtomicRMWOp op,
                       Type type,
                       uint8_t bytes) {
  auto mem = maybeMemidx(ctx);
  CHECK_ERR(mem);
  auto arg = memarg(ctx, bytes);
  CHECK_ERR(arg);
  return ctx.makeAtomicRMW(
    pos, annotations, op, type, bytes, mem.getPtr(), *arg);
}